

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrix.h
# Opt level: O1

void __thiscall
Eigen::
GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,-1,-1,false>,-1,-1,false>,Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,-1,-1,false>,-1,-1,false>,5>
::
scaleAndAddTo<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,_1,_1,false>>
          (GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,_1,_1,false>,Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>,_1,_1,false>,_1,_1,false>,5>
           *this,Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>
                 *dst,Scalar *alpha)

{
  Scalar SVar1;
  BlockingType blocking;
  gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false> local_98;
  gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0>,_Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_Eigen::internal::gemm_blocking_space<0,_double,_double,__1,__1,__1,_1,_false>_>
  local_48;
  
  local_98.super_level3_blocking<double,_double>.m_mc =
       (dst->
       super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
       ).
       super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
       .
       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_1>
       .
       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_0>
       .m_rows.m_value;
  if (local_98.super_level3_blocking<double,_double>.m_mc == *(long *)(this + 8)) {
    local_98.super_level3_blocking<double,_double>.m_nc =
         (dst->
         super_BlockImpl<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_Eigen::Dense>
         ).
         super_BlockImpl_dense<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false,_true>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_1>
         .
         super_MapBase<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>,_0>
         .m_cols.m_value;
    if (local_98.super_level3_blocking<double,_double>.m_nc == *(long *)(this + 0x70)) {
      if (((*(long *)(this + 0x70) != 0) && (*(long *)(this + 8) != 0)) &&
         (local_98.super_level3_blocking<double,_double>.m_kc = *(DenseIndex *)(this + 0x10),
         local_98.super_level3_blocking<double,_double>.m_kc != 0)) {
        SVar1 = *alpha;
        local_98.super_level3_blocking<double,_double>.m_blockW = (RhsScalar *)0x0;
        local_98.super_level3_blocking<double,_double>.m_blockA = (LhsScalar *)0x0;
        local_98.super_level3_blocking<double,_double>.m_blockB = (RhsScalar *)0x0;
        internal::computeProductBlockingSizes<double,double,1,long>
                  (&local_98.super_level3_blocking<double,_double>.m_kc,
                   &local_98.super_level3_blocking<double,_double>.m_mc,
                   &local_98.super_level3_blocking<double,_double>.m_nc);
        local_98.m_sizeA =
             local_98.super_level3_blocking<double,_double>.m_mc *
             local_98.super_level3_blocking<double,_double>.m_kc;
        local_98.m_sizeB =
             local_98.super_level3_blocking<double,_double>.m_nc *
             local_98.super_level3_blocking<double,_double>.m_kc;
        local_98.m_sizeW = local_98.super_level3_blocking<double,_double>.m_kc << 3;
        local_48.m_blocking = &local_98;
        local_48.m_lhs =
             (Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>
              *)this;
        local_48.m_rhs =
             (Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,__1,__1,_false>
              *)(this + 0x60);
        local_48.m_dest = dst;
        local_48.m_actualAlpha = SVar1;
        internal::
        gemm_functor<double,_long,_Eigen::internal::general_matrix_matrix_product<long,_double,_0,_false,_double,_0,_false,_0>,_Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>,_-1,_-1,_false>,_Eigen::internal::gemm_blocking_space<0,_double,_double,_-1,_-1,_-1,_1,_false>_>
        ::operator()(&local_48,0,*(long *)(this + 8),0,*(long *)(this + 0x70),
                     (GemmParallelInfo<long> *)0x0);
        free(local_98.super_level3_blocking<double,_double>.m_blockA);
        free(local_98.super_level3_blocking<double,_double>.m_blockB);
        free(local_98.super_level3_blocking<double,_double>.m_blockW);
      }
      return;
    }
  }
  __assert_fail("dst.rows()==m_lhs.rows() && dst.cols()==m_rhs.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/jeremy-shannon[P]CarND-Extended-Kalman-Filter-Project/src/Eigen/src/Core/products/GeneralMatrixMatrix.h"
                ,0x193,
                "void Eigen::GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>>, Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>>, 5>::scaleAndAddTo(Dest &, const Scalar &) const [Lhs = Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>>, Rhs = Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>>, ProductType = 5, Dest = Eigen::Block<Eigen::Block<Eigen::Map<Eigen::Matrix<double, -1, -1>>>>]"
               );
}

Assistant:

void scaleAndAddTo(Dest& dst, const Scalar& alpha) const
    {
      eigen_assert(dst.rows()==m_lhs.rows() && dst.cols()==m_rhs.cols());
      if(m_lhs.cols()==0 || m_lhs.rows()==0 || m_rhs.cols()==0)
        return;

      typename internal::add_const_on_value_type<ActualLhsType>::type lhs = LhsBlasTraits::extract(m_lhs);
      typename internal::add_const_on_value_type<ActualRhsType>::type rhs = RhsBlasTraits::extract(m_rhs);

      Scalar actualAlpha = alpha * LhsBlasTraits::extractScalarFactor(m_lhs)
                                 * RhsBlasTraits::extractScalarFactor(m_rhs);

      typedef internal::gemm_blocking_space<(Dest::Flags&RowMajorBit) ? RowMajor : ColMajor,LhsScalar,RhsScalar,
              Dest::MaxRowsAtCompileTime,Dest::MaxColsAtCompileTime,MaxDepthAtCompileTime> BlockingType;

      typedef internal::gemm_functor<
        Scalar, Index,
        internal::general_matrix_matrix_product<
          Index,
          LhsScalar, (_ActualLhsType::Flags&RowMajorBit) ? RowMajor : ColMajor, bool(LhsBlasTraits::NeedToConjugate),
          RhsScalar, (_ActualRhsType::Flags&RowMajorBit) ? RowMajor : ColMajor, bool(RhsBlasTraits::NeedToConjugate),
          (Dest::Flags&RowMajorBit) ? RowMajor : ColMajor>,
        _ActualLhsType, _ActualRhsType, Dest, BlockingType> GemmFunctor;

      BlockingType blocking(dst.rows(), dst.cols(), lhs.cols());

      internal::parallelize_gemm<(Dest::MaxRowsAtCompileTime>32 || Dest::MaxRowsAtCompileTime==Dynamic)>(GemmFunctor(lhs, rhs, dst, actualAlpha, blocking), this->rows(), this->cols(), Dest::Flags&RowMajorBit);
    }